

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O3

void __thiscall
asmjit::FuncArgsContext::WorkData::swap
          (WorkData *this,uint32_t aVarId,uint32_t aRegId,uint32_t bVarId,uint32_t bRegId)

{
  uint uVar1;
  uint extraout_EDX;
  uint8_t uVar2;
  
  if (aRegId < 0x20) {
    if ((this->_assignedRegs >> (aRegId & 0x1f) & 1) == 0) goto LAB_0011796f;
    if (0x1f < bRegId) goto LAB_00117974;
    if ((this->_assignedRegs >> (bRegId & 0x1f) & 1) == 0) goto LAB_00117979;
    if (this->_physToVarId[aRegId] != aVarId) goto LAB_0011797e;
    if (this->_physToVarId[bRegId] == bVarId) {
      this->_physToVarId[aRegId] = (uint8_t)bVarId;
      this->_physToVarId[bRegId] = (uint8_t)aVarId;
      return;
    }
  }
  else {
    swap();
LAB_0011796f:
    swap();
LAB_00117974:
    swap();
LAB_00117979:
    swap();
LAB_0011797e:
    swap();
  }
  uVar2 = (uint8_t)aVarId;
  swap();
  if (extraout_EDX < 0x20) {
    uVar1 = this->_assignedRegs;
    if ((uVar1 >> (extraout_EDX & 0x1f) & 1) == 0) {
      if (this->_physToVarId[extraout_EDX] == 0xff) {
        this->_physToVarId[extraout_EDX] = uVar2;
        this->_assignedRegs = uVar1 ^ 1 << ((byte)extraout_EDX & 0x1f);
        return;
      }
      goto LAB_001179c1;
    }
  }
  else {
    assign();
  }
  assign();
LAB_001179c1:
  assign();
  *(undefined ***)this = &PTR__BaseEmitter_00154660;
  *(uint8_t *)&this->_usedRegs = uVar2;
  this->_assignedRegs = 0;
  this->_dstRegs = 1;
  *(undefined4 *)((long)&this->_usedRegs + 1) = 0;
  this->_dstShuf = 0;
  this->_numSwaps = '\0';
  this->_numStackArgs = '\0';
  this->_reserved[0] = '\0';
  this->_reserved[1] = '\0';
  *(undefined8 *)(this->_reserved + 2) = 0;
  this->_physToVarId[4] = '\0';
  this->_physToVarId[5] = '\0';
  this->_physToVarId[6] = '\0';
  this->_physToVarId[7] = '\0';
  this->_physToVarId[8] = '\0';
  this->_physToVarId[9] = '\0';
  this->_physToVarId[10] = '\0';
  this->_physToVarId[0xb] = '\0';
  this->_physToVarId[0xc] = '\0';
  this->_physToVarId[0xd] = '\0';
  this->_physToVarId[0xe] = '\0';
  this->_physToVarId[0xf] = '\0';
  this->_physToVarId[0x10] = '\0';
  this->_physToVarId[0x11] = '\0';
  this->_physToVarId[0x12] = '\0';
  this->_physToVarId[0x13] = '\0';
  this->_physToVarId[0x14] = '\0';
  this->_physToVarId[0x15] = '\0';
  this->_physToVarId[0x16] = '\0';
  this->_physToVarId[0x17] = '\0';
  this->_physToVarId[0x18] = '\0';
  this->_physToVarId[0x19] = '\0';
  this->_physToVarId[0x1a] = '\0';
  this->_physToVarId[0x1b] = '\0';
  *(undefined8 *)(this->_physToVarId + 0x1c) = 0;
  this[1]._archRegs = 0;
  this[1]._workRegs = 0;
  this[1]._usedRegs = 0;
  this[1]._assignedRegs = 0;
  return;
}

Assistant:

inline void swap(uint32_t aVarId, uint32_t aRegId, uint32_t bVarId, uint32_t bRegId) noexcept {
      ASMJIT_ASSERT(isAssigned(aRegId));
      ASMJIT_ASSERT(isAssigned(bRegId));
      ASMJIT_ASSERT(_physToVarId[aRegId] == aVarId);
      ASMJIT_ASSERT(_physToVarId[bRegId] == bVarId);

      _physToVarId[aRegId] = uint8_t(bVarId);
      _physToVarId[bRegId] = uint8_t(aVarId);
    }